

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

void hdr_init_preallocated(hdr_histogram *h,hdr_histogram_bucket_config *cfg)

{
  int64_t iVar1;
  int32_t iVar2;
  
  iVar1 = cfg->highest_trackable_value;
  h->lowest_discernible_value = cfg->lowest_discernible_value;
  h->highest_trackable_value = iVar1;
  iVar1 = cfg->significant_figures;
  h->unit_magnitude = (int)cfg->unit_magnitude;
  h->significant_figures = (int)iVar1;
  iVar2 = cfg->sub_bucket_half_count;
  h->sub_bucket_half_count_magnitude = cfg->sub_bucket_half_count_magnitude;
  h->sub_bucket_half_count = iVar2;
  h->sub_bucket_mask = cfg->sub_bucket_mask;
  h->min_value = 0x7fffffffffffffff;
  h->max_value = 0;
  h->normalizing_index_offset = 0;
  h->conversion_ratio = 1.0;
  iVar2 = cfg->bucket_count;
  h->sub_bucket_count = cfg->sub_bucket_count;
  h->bucket_count = iVar2;
  h->counts_len = cfg->counts_len;
  h->total_count = 0;
  return;
}

Assistant:

void hdr_init_preallocated(struct hdr_histogram* h, struct hdr_histogram_bucket_config* cfg)
{
    h->lowest_discernible_value        = cfg->lowest_discernible_value;
    h->highest_trackable_value         = cfg->highest_trackable_value;
    h->unit_magnitude                  = (int32_t)cfg->unit_magnitude;
    h->significant_figures             = (int32_t)cfg->significant_figures;
    h->sub_bucket_half_count_magnitude = cfg->sub_bucket_half_count_magnitude;
    h->sub_bucket_half_count           = cfg->sub_bucket_half_count;
    h->sub_bucket_mask                 = cfg->sub_bucket_mask;
    h->sub_bucket_count                = cfg->sub_bucket_count;
    h->min_value                       = INT64_MAX;
    h->max_value                       = 0;
    h->normalizing_index_offset        = 0;
    h->conversion_ratio                = 1.0;
    h->bucket_count                    = cfg->bucket_count;
    h->counts_len                      = cfg->counts_len;
    h->total_count                     = 0;
}